

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

void __thiscall
HashCallback<Blob<224>_>::operator()(HashCallback<Blob<224>_> *this,void *key,int len)

{
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *this_00;
  pointer pBVar1;
  long lVar2;
  Blob<224> h;
  uint8_t local_38 [32];
  
  this_00 = this->m_hashes;
  std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::resize
            (this_00,((long)(this_00->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 + 1)
  ;
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0x18] = '\0';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  (*this->m_pfHash)(key,len,0,local_38);
  lVar2 = -0x1c;
  pBVar1 = (this->m_hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pBVar1->bytes[lVar2] = local_38[lVar2 + 0x1c];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }